

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynAlign * ParseAlign(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  Lexeme *end;
  Lexeme *pLVar2;
  SynNumber *local_28;
  SynBase *value;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_align);
  if (bVar1) {
    anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' expected after align");
    bVar1 = anon_unknown.dwarf_104b6::CheckAt
                      (ctx,lex_number,"ERROR: alignment value not found after align(");
    if (bVar1) {
      local_28 = ParseNumber(ctx);
    }
    else {
      local_28 = (SynNumber *)ParseContext::get<SynError>(ctx);
      pLVar2 = ParseContext::Current(ctx);
      end = ParseContext::Current(ctx);
      SynError::SynError((SynError *)local_28,pLVar2,end);
    }
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' expected after alignment value");
    ctx_local = (ParseContext *)ParseContext::get<SynAlign>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    SynAlign::SynAlign((SynAlign *)ctx_local,begin,pLVar2,&local_28->super_SynBase);
  }
  else {
    bVar1 = ParseContext::Consume(ctx,lex_noalign);
    if (bVar1) {
      ctx_local = (ParseContext *)ParseContext::get<SynAlign>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      SynAlign::SynAlign((SynAlign *)ctx_local,begin,pLVar2,(SynBase *)0x0);
    }
    else {
      ctx_local = (ParseContext *)0x0;
    }
  }
  return (SynAlign *)ctx_local;
}

Assistant:

SynAlign* ParseAlign(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_align))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' expected after align");

		SynBase *value = NULL;

		if(CheckAt(ctx, lex_number, "ERROR: alignment value not found after align("))
			value = ParseNumber(ctx);
		else
			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());

		CheckConsume(ctx, lex_cparen, "ERROR: ')' expected after alignment value");

		return new (ctx.get<SynAlign>()) SynAlign(start, ctx.Previous(), value);
	}
	else if(ctx.Consume(lex_noalign))
	{
		return new (ctx.get<SynAlign>()) SynAlign(start, ctx.Previous(), NULL);
	}

	return NULL;
}